

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::verifyTexture
          (FunctionalTest12 *this,texture *texture,GLuint *expected_color)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_28,0x400);
  Utils::texture::get(texture,0x8d99,0x1405,
                      local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  puVar1 = local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 3;
  uVar2 = 0;
  bVar4 = false;
  do {
    lVar3 = 0;
    do {
      if ((((*(GLuint *)((long)puVar1 + lVar3 + -0xc) != *expected_color) ||
           (*(GLuint *)((long)puVar1 + lVar3 + -8) != expected_color[1])) ||
          (*(GLuint *)((long)puVar1 + lVar3 + -4) != expected_color[2])) ||
         (*(GLuint *)((long)puVar1 + lVar3) != expected_color[3])) goto LAB_0098236d;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x100);
    bVar4 = 0xe < uVar2;
    uVar2 = uVar2 + 1;
    puVar1 = puVar1 + 0x40;
  } while (uVar2 != 0x10);
LAB_0098236d:
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool FunctionalTest12::verifyTexture(Utils::texture& texture, const GLuint expected_color[4]) const
{
	std::vector<GLuint> results;
	results.resize(m_texture_width * m_texture_height * 4);

	texture.get(GL_RGBA_INTEGER, GL_UNSIGNED_INT, &results[0]);

	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset = line_offset + x * 4;
			bool		 result		  = true;

			result = result && (results[point_offset + 0] == expected_color[0]);
			result = result && (results[point_offset + 1] == expected_color[1]);
			result = result && (results[point_offset + 2] == expected_color[2]);
			result = result && (results[point_offset + 3] == expected_color[3]);

			if (false == result)
			{
				return false;
			}
		}
	}

	return true;
}